

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valgen.cpp
# Opt level: O0

bool have_palette_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *this;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object window;
  Am_Object *self_local;
  
  window.data = (Am_Object_Data *)self;
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)self,0x170);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)&local_20);
  Am_Object::~Am_Object(&local_20);
  this = Am_Object::Peek(&local_18,Am_REGISTRY_FOR_PALETTES,0);
  bVar1 = Am_Value::Valid(this);
  Am_Object::~Am_Object(&local_18);
  return bVar1;
}

Assistant:

Am_Define_Formula(bool, have_palette)
{
  Am_Object window = self.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  return (window.Peek(Am_REGISTRY_FOR_PALETTES).Valid());
}